

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O1

void deqp::gles2::Functional::validTex2DAttachmentsTest(TestContext *testCtx,Context *context)

{
  long lVar1;
  
  (*context->_vptr_Context[9])(context,0x8d40,1);
  (*context->_vptr_Context[6])(context,0xde1,1);
  lVar1 = 0;
  do {
    (*context->_vptr_Context[0x1e])
              (context,0x8d40,
               (ulong)*(uint *)((long)validTex2DAttachmentsTest::attachmentPoints + lVar1),0xde1,1,0
              );
    checkError(testCtx,context,0);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  return;
}

Assistant:

static void validTex2DAttachmentsTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	context.bindFramebuffer(GL_FRAMEBUFFER, 1);
	static const GLenum attachmentPoints[] =
	{
		GL_COLOR_ATTACHMENT0,
		GL_DEPTH_ATTACHMENT,
		GL_STENCIL_ATTACHMENT
	};

	// Texture2D
	deUint32 tex2D = 1;
	context.bindTexture(GL_TEXTURE_2D, tex2D);
	for (int pointNdx = 0; pointNdx < DE_LENGTH_OF_ARRAY(attachmentPoints); pointNdx++)
	{
		context.framebufferTexture2D(GL_FRAMEBUFFER, attachmentPoints[pointNdx], GL_TEXTURE_2D, tex2D, 0);
		checkError(testCtx, context, GL_NO_ERROR);
	}
}